

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::RepeatedField<float>::erase
          (RepeatedField<float> *this,const_iterator first,const_iterator last)

{
  const_iterator pfVar1;
  const_iterator __result;
  iterator pfVar2;
  long in_RDX;
  long in_RSI;
  float *in_RDI;
  int in_stack_0000001c;
  RepeatedField<float> *in_stack_00000020;
  size_type first_offset;
  RepeatedField<float> *in_stack_ffffffffffffffc0;
  float *in_stack_ffffffffffffffc8;
  
  pfVar1 = cbegin((RepeatedField<float> *)0x5e6bbc);
  if (in_RSI != in_RDX) {
    __result = cend(in_stack_ffffffffffffffc0);
    begin((RepeatedField<float> *)0x5e6bfd);
    std::copy<float_const*,float*>(in_RDI,in_stack_ffffffffffffffc8,__result);
    cbegin((RepeatedField<float> *)0x5e6c29);
    Truncate(in_stack_00000020,in_stack_0000001c);
  }
  pfVar2 = begin((RepeatedField<float> *)0x5e6c4e);
  return pfVar2 + (int)(in_RSI - (long)pfVar1 >> 2);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}